

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

int nn_sock_getopt_inner(nn_sock *self,int level,int option,void *optval,size_t *optvallen)

{
  _func_int_nn_sockbase_ptr_int_int_void_ptr_size_t_ptr *UNRECOVERED_JUMPTABLE;
  int iVar1;
  nn_fd nVar2;
  undefined8 in_RAX;
  nn_optset *pnVar3;
  size_t sVar4;
  undefined8 *__src;
  nn_efd *self_00;
  int intval;
  nn_fd fd;
  undefined8 local_28;
  
  if (0 < level) {
    UNRECOVERED_JUMPTABLE = self->sockbase->vfptr->getopt;
    if (UNRECOVERED_JUMPTABLE == (_func_int_nn_sockbase_ptr_int_int_void_ptr_size_t_ptr *)0x0) {
      return -0x5c;
    }
    iVar1 = (*UNRECOVERED_JUMPTABLE)(self->sockbase,level,option,optval,optvallen);
    return iVar1;
  }
  if (level < 0) {
    pnVar3 = nn_sock_optset(self,level);
    if (pnVar3 == (nn_optset *)0x0) {
      return -0x5c;
    }
    iVar1 = (*pnVar3->vfptr->getopt)(pnVar3,option,optval,optvallen);
    return iVar1;
  }
  iVar1 = -0x5c;
  local_28._4_4_ = (uint)((ulong)in_RAX >> 0x20);
  switch(option) {
  case 1:
    local_28 = (ulong)local_28._4_4_ << 0x20;
    goto LAB_00124b3a;
  case 2:
    iVar1 = self->sndbuf;
    break;
  case 3:
    iVar1 = self->rcvbuf;
    break;
  case 4:
    iVar1 = self->sndtimeo;
    break;
  case 5:
    iVar1 = self->rcvtimeo;
    break;
  case 6:
    iVar1 = self->reconnect_ivl;
    break;
  case 7:
    iVar1 = self->reconnect_ivl_max;
    break;
  case 8:
    iVar1 = (self->ep_template).sndprio;
    break;
  case 9:
    iVar1 = (self->ep_template).rcvprio;
    break;
  case 10:
    if ((self->socktype->flags & 2) != 0) {
      return -0x5c;
    }
    self_00 = &self->sndfd;
    goto LAB_00124b0f;
  case 0xb:
    if ((self->socktype->flags & 1) != 0) {
      return -0x5c;
    }
    self_00 = &self->rcvfd;
LAB_00124b0f:
    local_28 = in_RAX;
    nVar2 = nn_efd_getfd(self_00);
    local_28 = CONCAT44(nVar2,(undefined4)local_28);
    sVar4 = 4;
    __src = (undefined8 *)((long)&local_28 + 4);
    if (*optvallen < 4) {
      sVar4 = *optvallen;
    }
    goto LAB_00124b4d;
  case 0xc:
    iVar1 = self->socktype->domain;
    break;
  case 0xd:
    iVar1 = self->socktype->protocol;
    break;
  case 0xe:
    iVar1 = (self->ep_template).ipv4only;
    break;
  case 0xf:
    strncpy((char *)optval,self->socket_name,*optvallen);
    sVar4 = strlen(self->socket_name);
    *optvallen = sVar4;
    goto LAB_00124b5c;
  case 0x10:
    iVar1 = self->rcvmaxsize;
    break;
  case 0x11:
    iVar1 = self->maxttl;
    break;
  default:
    goto switchD_00124a05_default;
  }
  local_28 = CONCAT44(local_28._4_4_,iVar1);
LAB_00124b3a:
  sVar4 = 4;
  __src = &local_28;
  if (*optvallen < 4) {
    sVar4 = *optvallen;
    __src = &local_28;
  }
LAB_00124b4d:
  memcpy(optval,__src,sVar4);
  *optvallen = 4;
LAB_00124b5c:
  iVar1 = 0;
switchD_00124a05_default:
  return iVar1;
}

Assistant:

int nn_sock_getopt_inner (struct nn_sock *self, int level,
    int option, void *optval, size_t *optvallen)
{
    struct nn_optset *optset;
    int intval;
    nn_fd fd;

    /*  Protocol-specific socket options. */
    if (level > NN_SOL_SOCKET) {
        if (self->sockbase->vfptr->getopt == NULL) {
            return -ENOPROTOOPT;
        }
        return self->sockbase->vfptr->getopt (self->sockbase,
            level, option, optval, optvallen);
    }

    /*  Transport-specific options. */
    if (level < NN_SOL_SOCKET) {
        optset = nn_sock_optset (self, level);
        if (!optset)
            return -ENOPROTOOPT;
        return optset->vfptr->getopt (optset, option, optval, optvallen);
    }

    nn_assert (level == NN_SOL_SOCKET);

    /*  Generic socket-level options. */
    switch (option) {
    case NN_DOMAIN:
        intval = self->socktype->domain;
        break;
    case NN_PROTOCOL:
        intval = self->socktype->protocol;
        break;
    case NN_LINGER:
        intval = 0;
        break;
    case NN_SNDBUF:
        intval = self->sndbuf;
        break;
    case NN_RCVBUF:
        intval = self->rcvbuf;
        break;
    case NN_RCVMAXSIZE:
        intval = self->rcvmaxsize;
        break;
    case NN_SNDTIMEO:
        intval = self->sndtimeo;
        break;
    case NN_RCVTIMEO:
        intval = self->rcvtimeo;
        break;
    case NN_RECONNECT_IVL:
        intval = self->reconnect_ivl;
        break;
    case NN_RECONNECT_IVL_MAX:
        intval = self->reconnect_ivl_max;
        break;
    case NN_SNDPRIO:
        intval = self->ep_template.sndprio;
        break;
    case NN_RCVPRIO:
        intval = self->ep_template.rcvprio;
        break;
    case NN_IPV4ONLY:
        intval = self->ep_template.ipv4only;
        break;
    case NN_MAXTTL:
        intval = self->maxttl;
        break;
    case NN_SNDFD:
        if (self->socktype->flags & NN_SOCKTYPE_FLAG_NOSEND)
            return -ENOPROTOOPT;
        fd = nn_efd_getfd (&self->sndfd);
        memcpy (optval, &fd,
            *optvallen < sizeof (nn_fd) ? *optvallen : sizeof (nn_fd));
        *optvallen = sizeof (nn_fd);
        return 0;
    case NN_RCVFD:
        if (self->socktype->flags & NN_SOCKTYPE_FLAG_NORECV)
            return -ENOPROTOOPT;
        fd = nn_efd_getfd (&self->rcvfd);
        memcpy (optval, &fd,
            *optvallen < sizeof (nn_fd) ? *optvallen : sizeof (nn_fd));
        *optvallen = sizeof (nn_fd);
        return 0;
    case NN_SOCKET_NAME:
        strncpy (optval, self->socket_name, *optvallen);
        *optvallen = strlen(self->socket_name);
        return 0;
    default:
        return -ENOPROTOOPT;
    }

    memcpy (optval, &intval,
        *optvallen < sizeof (int) ? *optvallen : sizeof (int));
    *optvallen = sizeof (int);

    return 0;
}